

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_tests.cpp
# Opt level: O0

void anon_unknown.dwarf_47aea5::CheckInferRaw(CScript *script)

{
  long lVar1;
  bool bVar2;
  pointer pDVar3;
  unit_test_log_t *in_RDI;
  long in_FS_OFFSET;
  unique_ptr<Descriptor,_std::default_delete<Descriptor>_> desc;
  FlatSigningProvider dummy_provider;
  FlatSigningProvider *in_stack_fffffffffffffe18;
  undefined7 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe27;
  assertion_result *in_stack_fffffffffffffe28;
  SigningProvider *in_stack_fffffffffffffe30;
  CScript *in_stack_fffffffffffffe38;
  size_type __pos;
  const_string *msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  const_string *in_stack_fffffffffffffe50;
  const_string local_1a0 [2];
  lazy_ostream local_180 [2];
  assertion_result local_160 [2];
  undefined1 local_120 [32];
  const_string local_100 [2];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  msg = local_100;
  FlatSigningProvider::FlatSigningProvider(in_stack_fffffffffffffe18);
  InferDescriptor(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
  do {
    __pos = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe28,
               (pointer)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
               (unsigned_long)in_stack_fffffffffffffe18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_RDI,in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48,msg);
    pDVar3 = std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::operator->
                       ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)
                        in_stack_fffffffffffffe18);
    (*pDVar3->_vptr_Descriptor[4])(local_120,pDVar3,0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
              (in_stack_fffffffffffffe48,(char *)msg,__pos);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffe28,(bool)in_stack_fffffffffffffe27);
    in_stack_fffffffffffffe28 = (assertion_result *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe28,
               (pointer)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
               (unsigned_long)in_stack_fffffffffffffe18);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
               (basic_cstring<const_char> *)in_stack_fffffffffffffe18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe28,
               (pointer)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
               (unsigned_long)in_stack_fffffffffffffe18);
    in_stack_fffffffffffffe18 = (FlatSigningProvider *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_160,local_180,local_1a0,0x27,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffffe18);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffe18);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe18);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::unique_ptr<Descriptor,_std::default_delete<Descriptor>_>::~unique_ptr
            ((unique_ptr<Descriptor,_std::default_delete<Descriptor>_> *)in_stack_fffffffffffffe28);
  FlatSigningProvider::~FlatSigningProvider(in_stack_fffffffffffffe18);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CheckInferRaw(const CScript& script)
{
    FlatSigningProvider dummy_provider;
    std::unique_ptr<Descriptor> desc = InferDescriptor(script, dummy_provider);
    BOOST_CHECK(desc->ToString().rfind("raw(", 0) == 0);
}